

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O2

GLenum __thiscall
polyscope::render::backend_openGL3_glfw::GLTextureBuffer::textureType(GLTextureBuffer *this)

{
  uint uVar1;
  GLenum GVar2;
  allocator local_29;
  string local_28;
  
  uVar1 = (this->super_TextureBuffer).dim - 1;
  if (uVar1 < 3) {
    GVar2 = *(GLenum *)(&DAT_004b18b0 + (ulong)uVar1 * 4);
  }
  else {
    std::__cxx11::string::string((string *)&local_28,"bad texture type",&local_29);
    exception(&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    GVar2 = 0xde0;
  }
  return GVar2;
}

Assistant:

GLenum GLTextureBuffer::textureType() {
  if (dim == 1) {
    return GL_TEXTURE_1D;
  } else if (dim == 2) {
    return GL_TEXTURE_2D;
  } else if (dim == 3) {
    return GL_TEXTURE_3D;
  }
  exception("bad texture type");
  return GL_TEXTURE_1D;
}